

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall van_kampen::Graph::removeOrientedEdge(Graph *this,nodeId_t a,nodeId_t b)

{
  removeOrientedEdge::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,a,b);
  removeOrientedEdge::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,b,a);
  return;
}

Assistant:

void Graph::removeOrientedEdge(nodeId_t a, nodeId_t b)
{
    auto maybeRemove = [this](nodeId_t x, nodeId_t y) {
        std::size_t id = 0;
        for (; id < node(x).transitions().size() && node(x).transitions()[id].to != y; ++id)
            ;
        if (id < node(x).transitions().size())
            node(x).transitions_.erase(node(x).transitions_.begin() + id);
    };
    maybeRemove(a, b);
    maybeRemove(b, a);
}